

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_dependent_join.cpp
# Opt level: O2

void duckdb::CreateDelimJoinConditions
               (LogicalComparisonJoin *delim_join,
               vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns,
               vector<duckdb::ColumnBinding,_true> *bindings,idx_t base_offset,bool perform_delim)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar1;
  const_reference args_2;
  reference args_2_00;
  InternalException *this;
  size_type __n;
  undefined3 in_register_00000081;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_70;
  size_type local_68;
  vector<duckdb::JoinCondition,_true> *local_60;
  JoinCondition cond;
  
  if (CONCAT31(in_register_00000081,perform_delim) == 0) {
    local_68 = 1;
  }
  else {
    local_68 = ((long)(correlated_columns->
                      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                      ).
                      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(correlated_columns->
                     super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                     ).
                     super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x50;
  }
  local_60 = &delim_join->conditions;
  __n = 0;
  while( true ) {
    if (local_68 == __n) {
      return;
    }
    args_2 = vector<duckdb::CorrelatedColumnInfo,_true>::get<true>(correlated_columns,__n);
    if ((ulong)((long)(bindings->
                      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
                      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(bindings->
                      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
                      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= base_offset + __n) break;
    cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    cond.right.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::ColumnBinding_const&>
              ((duckdb *)&local_70,&args_2->name,&args_2->type,&args_2->binding);
    uVar1 = cond.left;
    cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)local_70;
    local_70._M_head_impl = (Expression *)0x0;
    if (uVar1.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)uVar1.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
      if (local_70._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
    }
    args_2_00 = vector<duckdb::ColumnBinding,_true>::get<true>(bindings,base_offset + __n);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::ColumnBinding&>
              ((duckdb *)&local_70,&args_2->name,&args_2->type,args_2_00);
    uVar1 = cond.right;
    cond.right.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)local_70;
    local_70._M_head_impl = (Expression *)0x0;
    if (uVar1.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)uVar1.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
      if (local_70._M_head_impl != (Expression *)0x0) {
        (*((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    cond.comparison = COMPARE_BOUNDARY_END;
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
    emplace_back<duckdb::JoinCondition>
              (&local_60->
                super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,&cond);
    JoinCondition::~JoinCondition(&cond);
    __n = __n + 1;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&cond,"Delim join - binding index out of range",(allocator *)&local_70);
  InternalException::InternalException(this,(string *)&cond);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void CreateDelimJoinConditions(LogicalComparisonJoin &delim_join,
                                      const vector<CorrelatedColumnInfo> &correlated_columns,
                                      vector<ColumnBinding> bindings, idx_t base_offset, bool perform_delim) {
	auto col_count = perform_delim ? correlated_columns.size() : 1;
	for (idx_t i = 0; i < col_count; i++) {
		auto &col = correlated_columns[i];
		auto binding_idx = base_offset + i;
		if (binding_idx >= bindings.size()) {
			throw InternalException("Delim join - binding index out of range");
		}
		JoinCondition cond;
		cond.left = make_uniq<BoundColumnRefExpression>(col.name, col.type, col.binding);
		cond.right = make_uniq<BoundColumnRefExpression>(col.name, col.type, bindings[binding_idx]);
		cond.comparison = ExpressionType::COMPARE_NOT_DISTINCT_FROM;
		delim_join.conditions.push_back(std::move(cond));
	}
}